

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLimitReadFile.cpp
# Opt level: O2

void __thiscall
irr::io::CLimitReadFile::CLimitReadFile
          (CLimitReadFile *this,IReadFile *alreadyOpenedFile,long pos,long areaSize,path *name)

{
  *(undefined8 *)&this->field_0x50 = 0;
  *(undefined4 *)&this->field_0x58 = 1;
  (this->super_IReadFile)._vptr_IReadFile = (_func_int **)0x286ce8;
  *(undefined8 *)&this->field_0x48 = 0x286d40;
  core::string<char>::string((string<char> *)&(this->super_IReadFile).field_0x8,name);
  this->Pos = 0;
  this->AreaStart = 0;
  this->AreaEnd = 0;
  this->File = alreadyOpenedFile;
  if (alreadyOpenedFile != (IReadFile *)0x0) {
    *(int *)(&alreadyOpenedFile->field_0x10 + (long)alreadyOpenedFile->_vptr_IReadFile[-3]) =
         *(int *)(&alreadyOpenedFile->field_0x10 + (long)alreadyOpenedFile->_vptr_IReadFile[-3]) + 1
    ;
    this->AreaStart = pos;
    this->AreaEnd = areaSize + pos;
  }
  return;
}

Assistant:

CLimitReadFile::CLimitReadFile(IReadFile *alreadyOpenedFile, long pos,
		long areaSize, const io::path &name) :
		Filename(name),
		AreaStart(0), AreaEnd(0), Pos(0),
		File(alreadyOpenedFile)
{
#ifdef _DEBUG
	setDebugName("CLimitReadFile");
#endif

	if (File) {
		File->grab();
		AreaStart = pos;
		AreaEnd = AreaStart + areaSize;
	}
}